

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O3

void __thiscall
boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>::
init_from_string<char,std::char_traits<char>,std::allocator<char>>
          (dynamic_bitset<unsigned_long,std::allocator<unsigned_long>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,size_type pos,
          size_type n,size_type num_bits)

{
  ctype cVar1;
  ctype cVar2;
  ctype cVar3;
  ulong uVar4;
  ctype *pcVar5;
  size_type sVar6;
  long lVar7;
  locale local_50 [8];
  ulong local_48;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  uVar4 = s->_M_string_length - pos;
  local_38 = s;
  if (s->_M_string_length < pos) {
    __assert_fail("pos <= s.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x170,
                  "void boost::dynamic_bitset<>::init_from_string(const std::basic_string<CharT, Traits, Alloc> &, typename std::basic_string<CharT, Traits, Alloc>::size_type, typename std::basic_string<CharT, Traits, Alloc>::size_type, size_type) [Block = unsigned long, Allocator = std::allocator<unsigned long>, CharT = char, Traits = std::char_traits<char>, Alloc = std::allocator<char>]"
                 );
  }
  local_48 = n;
  if (uVar4 < n) {
    local_48 = uVar4;
  }
  sVar6 = num_bits;
  if (num_bits == 0xffffffffffffffff) {
    sVar6 = local_48;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
             ((sVar6 >> 6) + 1) - (ulong)((sVar6 & 0x3f) == 0));
  *(size_type *)(this + 0x18) = sVar6;
  std::locale::locale(local_50);
  pcVar5 = std::use_facet<std::ctype<char>>(local_50);
  local_40 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  std::locale::~locale(local_50);
  if (pcVar5[0x38] == (ctype)0x0) {
    std::ctype<char>::_M_widen_init();
    cVar2 = (ctype)(**(code **)(*(long *)pcVar5 + 0x30))(pcVar5,0x31);
  }
  else {
    cVar2 = pcVar5[0x6a];
  }
  if (local_48 < num_bits) {
    num_bits = local_48;
  }
  if (num_bits != 0) {
    lVar7 = pos + num_bits;
    sVar6 = 0;
    do {
      cVar1 = *(ctype *)((local_38->_M_dataplus)._M_p + lVar7 + -1);
      if (cVar1 == cVar2) {
        dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(local_40,sVar6,true);
      }
      else {
        if (pcVar5[0x38] == (ctype)0x0) {
          std::ctype<char>::_M_widen_init();
          cVar3 = (ctype)(**(code **)(*(long *)pcVar5 + 0x30))(pcVar5,0x30);
        }
        else {
          cVar3 = pcVar5[0x69];
        }
        if (cVar1 != cVar3) {
          __assert_fail("Tr::eq(c, one) || Tr::eq(c, BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, \'0\'))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                        ,0x185,
                        "void boost::dynamic_bitset<>::init_from_string(const std::basic_string<CharT, Traits, Alloc> &, typename std::basic_string<CharT, Traits, Alloc>::size_type, typename std::basic_string<CharT, Traits, Alloc>::size_type, size_type) [Block = unsigned long, Allocator = std::allocator<unsigned long>, CharT = char, Traits = std::char_traits<char>, Alloc = std::allocator<char>]"
                       );
        }
      }
      sVar6 = sVar6 + 1;
      lVar7 = lVar7 + -1;
    } while (sVar6 != num_bits);
  }
  return;
}

Assistant:

void init_from_string(const std::basic_string<CharT, Traits, Alloc>& s,
        typename std::basic_string<CharT, Traits, Alloc>::size_type pos,
        typename std::basic_string<CharT, Traits, Alloc>::size_type n,
        size_type num_bits)
    {
        assert(pos <= s.size());

        typedef typename std::basic_string<CharT, Traits, Alloc> StrT;
        typedef typename StrT::traits_type Tr;

        const typename StrT::size_type rlen = (std::min)(n, s.size() - pos);
        const size_type sz = ( num_bits != npos? num_bits : rlen);
        m_bits.resize(calc_num_blocks(sz));
        m_num_bits = sz;


        BOOST_DYNAMIC_BITSET_CTYPE_FACET(CharT, fac, std::locale());
        const CharT one = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

        const size_type m = num_bits < rlen ? num_bits : rlen;
        typename StrT::size_type i = 0;
        for( ; i < m; ++i) {

            const CharT c = s[(pos + m - 1) - i];

            assert( Tr::eq(c, one)
                    || Tr::eq(c, BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0')) );

            if (Tr::eq(c, one))
                set(i);

        }

    }